

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

void __thiscall cmFileListGeneratorGlob::~cmFileListGeneratorGlob(cmFileListGeneratorGlob *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmFileListGeneratorBase *pcVar3;
  
  (this->super_cmFileListGeneratorBase)._vptr_cmFileListGeneratorBase =
       (_func_int **)&PTR__cmFileListGeneratorGlob_00612eb0;
  pcVar2 = (this->Pattern)._M_dataplus._M_p;
  paVar1 = &(this->Pattern).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_cmFileListGeneratorBase)._vptr_cmFileListGeneratorBase =
       (_func_int **)&PTR__cmFileListGeneratorBase_00612d60;
  pcVar3 = (this->super_cmFileListGeneratorBase).Next.x_;
  if (pcVar3 != (cmFileListGeneratorBase *)0x0) {
    (*pcVar3->_vptr_cmFileListGeneratorBase[1])();
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

cmFileListGeneratorGlob(std::string const& str):
    cmFileListGeneratorBase(), Pattern(str) {}